

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_loader.c
# Opt level: O1

int sys_onloadlist(char *classname)

{
  t_symbol *ptVar1;
  t_loadlist **pptVar2;
  
  ptVar1 = gensym(classname);
  pptVar2 = &sys_loaded;
  do {
    pptVar2 = &((t_loadlist *)pptVar2)->ll_next->ll_next;
    if ((t_loadlist *)pptVar2 == (t_loadlist *)0x0) {
      return 0;
    }
  } while (((t_loadlist *)pptVar2)->ll_name != ptVar1);
  return 1;
}

Assistant:

int sys_onloadlist(const char *classname) /* return true if already loaded */
{
    t_symbol *s = gensym(classname);
    t_loadlist *ll;
    for (ll = sys_loaded; ll; ll = ll->ll_next)
        if (ll->ll_name == s)
            return (1);
    return (0);
}